

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.c
# Opt level: O2

void game_Run(void)

{
  ECommand_t EVar1;
  _Bool _Var2;
  char cVar3;
  int iVar4;
  int iVar5;
  ECommand_t EVar6;
  ECommand_t EVar7;
  uint uVar8;
  int i;
  char *message;
  int j;
  
  dd_Init();
  InitNewGame();
  EVar6 = ActiveCmd;
LAB_00101d95:
  do {
    ActiveCmd = EVar6;
    if (ToExit != '\0') {
      dd_Save();
      dspl_Clear();
      return;
    }
    _Var2 = tbl_IsVictory();
    if (!_Var2) {
      dspl_Render(ActiveCmd);
      dspl_SetMessage("");
      cVar3 = input_ReadKey();
      EVar7 = ctrl_KeyToCmd(cVar3);
      switch(EVar7) {
      case CMD_EXIT:
switchD_00101e35_caseD_1:
        ToExit = '\x01';
        EVar6 = ActiveCmd;
        goto LAB_00101d95;
      case CMD_RESET:
        InitNewGame();
        EVar6 = ActiveCmd;
        goto LAB_00101d95;
      case CMD_HELP:
        dspl_ShowHelp();
        EVar6 = ActiveCmd;
        goto LAB_00101d95;
      case CMD_SCHEME:
        dspl_ChangeColorScheme();
        EVar6 = ActiveCmd;
        goto LAB_00101d95;
      }
      if (EVar7 != CMD_HACK) {
        if (ActiveCmd == CMD_NONE) {
          EVar6 = EVar7;
          if (0xb < EVar7 - CMD_PACK) {
            if (EVar7 == CMD_NEXT) {
              tbl_DrawNextCard();
              EVar6 = ActiveCmd;
            }
            else if (EVar7 == CMD_LAZY) {
              for (iVar4 = 0; iVar4 != 7; iVar4 = iVar4 + 1) {
                for (iVar5 = 0; iVar5 != 7; iVar5 = iVar5 + 1) {
                  if (((iVar4 != iVar5) && (_Var2 = tbl_IsRevealingDeskMove(iVar4,iVar5), _Var2)) &&
                     (_Var2 = tbl_MoveDeskToDesk(iVar4,iVar5), EVar6 = ActiveCmd, _Var2))
                  goto LAB_00101d95;
                }
              }
              iVar4 = 0;
              do {
                if (iVar4 == 7) {
                  iVar4 = 0;
                  goto LAB_00102028;
                }
                _Var2 = tbl_MovePackToDesk(iVar4);
                iVar4 = iVar4 + 1;
                EVar6 = ActiveCmd;
              } while (!_Var2);
            }
            else {
LAB_00101fa0:
              if (FirstFail == '\0') {
                dspl_SetMessage("!! Invalid key - press H for help");
                FirstFail = '\x01';
                EVar6 = ActiveCmd;
              }
              else {
                dspl_SetMessage("!! Invalid key");
                EVar6 = ActiveCmd;
              }
            }
          }
          goto LAB_00101d95;
        }
        uVar8 = EVar7 - CMD_COLOR0;
        if (uVar8 < 4 || ActiveCmd == EVar7) {
          if (ActiveCmd == CMD_PACK) {
            _Var2 = tbl_MovePackToColors();
          }
          else if (ActiveCmd - CMD_DESK0 < 7) {
            if (3 < uVar8) {
              uVar8 = 0;
            }
            if (EVar7 - CMD_DESK0 < 7) {
              uVar8 = EVar7 - CMD_DESK0;
            }
            _Var2 = tbl_MoveDeskToColors(uVar8);
          }
          else {
            _Var2 = false;
          }
          EVar1 = ActiveCmd;
          ActiveCmd = CMD_NONE;
          EVar6 = ActiveCmd;
          if ((_Var2 != false) || (EVar1 == EVar7)) goto LAB_00101d95;
        }
        else {
          uVar8 = EVar7 - CMD_DESK0;
          if (uVar8 < 7) {
            if (ActiveCmd == CMD_PACK) {
              _Var2 = tbl_MovePackToDesk(uVar8);
            }
            else if (ActiveCmd - CMD_DESK0 < 7) {
              _Var2 = tbl_MoveDeskToDesk(ActiveCmd - CMD_DESK0,uVar8);
            }
            else {
              if (3 < ActiveCmd - CMD_COLOR0) goto LAB_00101efc;
              _Var2 = tbl_MoveColorsToDesk(ActiveCmd - CMD_COLOR0,uVar8);
            }
            ActiveCmd = CMD_NONE;
LAB_00101fea:
            EVar6 = ActiveCmd;
            if (_Var2 != false) goto LAB_00101d95;
          }
          else {
            if (EVar7 != CMD_PACK) {
              ActiveCmd = CMD_NONE;
              goto LAB_00101fa0;
            }
LAB_00101efc:
            ActiveCmd = CMD_NONE;
          }
        }
        dspl_SetMessage("!! Invalid move");
        EVar6 = ActiveCmd;
        goto LAB_00101d95;
      }
      dspl_HackerMode();
      EVar6 = ActiveCmd;
      goto LAB_00101d95;
    }
    iVar4 = tbl_GetCurrentScore();
    iVar5 = dd_GetHighScore();
    message = "CONGRATULATIONS, YOU HAVE WON!!!";
    if (iVar5 < iVar4) {
      message = "CONGRATULATIONS, YOU HAVE WON WITH NEW TOP SCORE!!!";
    }
    dspl_SetMessage(message);
    dspl_Render(CMD_NONE);
    iVar5 = dd_GetHighScore();
    if (iVar5 < iVar4) {
      dd_SetHighScore(iVar4);
    }
    dd_Save();
    cVar3 = dspl_Victory();
    EVar6 = ctrl_KeyToCmd(cVar3);
    if (EVar6 == CMD_EXIT) goto switchD_00101e35_caseD_1;
    InitNewGame();
    dspl_SetMessage("");
    EVar6 = ActiveCmd;
  } while( true );
  while( true ) {
    _Var2 = tbl_MoveDeskToColors(iVar4);
    iVar4 = iVar4 + 1;
    EVar6 = ActiveCmd;
    if (_Var2) break;
LAB_00102028:
    if (iVar4 == 7) {
      _Var2 = tbl_MovePackToColors();
      goto LAB_00101fea;
    }
  }
  goto LAB_00101d95;
}

Assistant:

void game_Run(void)
{
  dd_Init();
  InitNewGame();

  while (!ToExit) {
    ECommand_t cmd;
    if (CheckVictory()) {
      // restart or exit game
      continue;
    }
    dspl_Render(ActiveCmd);
    dspl_SetMessage("");

    cmd = ctrl_KeyToCmd(input_ReadKey());

    if (ControlGame(cmd) || ControlDisplay(cmd) || ControlTable(cmd)) {
      continue;
    } else {
      if (FirstFail) {
        dspl_SetMessage("!! Invalid key - press H for help");
        FirstFail = false;
      } else {
        dspl_SetMessage("!! Invalid key");
      }
    }
  }

  dd_Save();
  dspl_Clear();
}